

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall
dxil_spv::Converter::add_local_root_constants
          (Converter *this,uint32_t register_space,uint32_t register_index,uint32_t num_words)

{
  value_type local_38;
  
  local_38.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.table_entries.
  super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._0_8_ = (ulong)register_space << 0x20;
  local_38.field_1.constants.num_words = num_words;
  local_38.field_1.constants.register_index = register_index;
  std::
  vector<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
  ::push_back(&((this->impl)._M_t.
                super___uniq_ptr_impl<dxil_spv::Converter::Impl,_std::default_delete<dxil_spv::Converter::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_dxil_spv::Converter::Impl_*,_std::default_delete<dxil_spv::Converter::Impl>_>
                .super__Head_base<0UL,_dxil_spv::Converter::Impl_*,_false>._M_head_impl)->
               local_root_signature,&local_38);
  std::
  _Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
  ::~_Vector_base(&local_38.table_entries.
                   super__Vector_base<dxil_spv::DescriptorTableEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::DescriptorTableEntry>_>
                 );
  return;
}

Assistant:

void Converter::add_local_root_constants(uint32_t register_space, uint32_t register_index, uint32_t num_words)
{
	LocalRootSignatureEntry entry = {};
	entry.type = LocalRootSignatureType::Constants;
	entry.constants.num_words = num_words;
	entry.constants.register_space = register_space;
	entry.constants.register_index = register_index;
	impl->local_root_signature.push_back(entry);
}